

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-parse.c
# Opt level: O2

fy_event * fy_parser_parse(fy_parser *fyp)

{
  fy_eventp *pfVar1;
  fy_event *pfVar2;
  
  if (fyp != (fy_parser *)0x0) {
    pfVar1 = fy_parse_private(fyp);
    pfVar2 = &pfVar1->e;
    if (pfVar1 == (fy_eventp *)0x0) {
      pfVar2 = (fy_event *)0x0;
    }
    return pfVar2;
  }
  return (fy_event *)0x0;
}

Assistant:

struct fy_event *fy_parser_parse(struct fy_parser *fyp) {
    struct fy_eventp *fyep;

    if (!fyp)
        return NULL;

    fyep = fy_parse_private(fyp);
    if (!fyep)
        return NULL;

    return &fyep->e;
}